

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

void __thiscall Heap<Astar<Tiles>::Node>::Maxq::push(Maxq *this,Node *n,int p)

{
  vector<Astar<Tiles>::Node*,std::allocator<Astar<Tiles>::Node*>> *this_00;
  iterator __position;
  ulong uVar1;
  ulong uVar2;
  Node *local_28;
  
  local_28 = n;
  if (-1 < p) {
    uVar1 = ((long)(this->bins).
                   super__Vector_base<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->bins).
                   super__Vector_base<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar2 = (ulong)(uint)p;
    if (uVar1 < uVar2 || uVar1 - uVar2 == 0) {
      std::
      vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
      ::resize(&this->bins,(ulong)(p + 1));
    }
    if (this->max < p) {
      this->max = p;
    }
    this_00 = (vector<Astar<Tiles>::Node*,std::allocator<Astar<Tiles>::Node*>> *)
              ((this->bins).
               super__Vector_base<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar2);
    __position._M_current = *(Node ***)(this_00 + 8);
    local_28->openind = (int)((ulong)((long)__position._M_current - *(long *)this_00) >> 3);
    if (__position._M_current == *(Node ***)(this_00 + 0x10)) {
      std::vector<Astar<Tiles>::Node*,std::allocator<Astar<Tiles>::Node*>>::
      _M_realloc_insert<Astar<Tiles>::Node*const&>(this_00,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    this->fill = this->fill + 1;
    return;
  }
  __assert_fail("p >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/heap.hpp"
                ,0x12,
                "void Heap<Astar<Tiles>::Node>::Maxq::push(HeapElm *, int) [HeapElm = Astar<Tiles>::Node]"
               );
}

Assistant:

void push(HeapElm *n, int p) {
			assert (p >= 0);
			if (bins.size() <= (unsigned int) p)
				bins.resize(p+1);

			if (p > max)
				max = p;

			n->openind = bins[p].size();
			bins[p].push_back(n);
			fill++;
		}